

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *handler)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  custom_00;
  uint id;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pbVar1;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *pbVar2;
  unkbyte10 in_stack_fffffffffffffda8;
  undefined6 in_stack_fffffffffffffdb2;
  char local_219;
  undefined1 auStack_1e0 [7];
  char c;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  adapter;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *handler_local;
  char *end_local;
  char *begin_local;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_1b0;
  buffer<char> *local_190;
  undefined1 auStack_188 [8];
  format_arg arg_1;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_138;
  basic_string_view<char> local_128 [3];
  format_arg *local_f8;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *local_f0;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_e8;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_e0;
  buffer<char> *local_c0;
  undefined1 auStack_b8 [8];
  format_arg arg;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_68;
  basic_string_view<char> local_58 [3];
  format_arg *local_20;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *local_18;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_10;
  
  end_local = begin + 1;
  adapter._8_8_ = handler;
  if (end_local == end) {
    error_handler::on_error((error_handler *)handler,"invalid format string");
  }
  if (*end_local == '}') {
    id = format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         ::on_arg_id(handler);
    pbVar2 = &handler->context;
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)auStack_b8,(detail *)pbVar2,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)id,id);
    local_e0.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(pbVar2);
    pbVar1 = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::args(pbVar2);
    local_e0.args.desc_ = pbVar1->desc_;
    local_e0.args.field_1 = pbVar1->field_1;
    local_e0.loc = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::locale
                             (pbVar2);
    local_20 = (format_arg *)auStack_b8;
    local_18 = &local_e0;
    switch(arg.value_.field_0.int128_value._8_4_) {
    case 0:
    default:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0);
      break;
    case 1:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,auStack_b8._0_4_);
      break;
    case 2:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,auStack_b8._0_4_);
      break;
    case 3:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,CONCAT44(auStack_b8._4_4_,auStack_b8._0_4_));
      break;
    case 4:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,CONCAT44(auStack_b8._4_4_,auStack_b8._0_4_));
      break;
    case 5:
      value._10_6_ = in_stack_fffffffffffffdb2;
      value._0_10_ = in_stack_fffffffffffffda8;
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,(__int128)value);
      break;
    case 6:
      value_00._10_6_ = in_stack_fffffffffffffdb2;
      value_00._0_10_ = in_stack_fffffffffffffda8;
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,(unsigned___int128)value_00);
      break;
    case 7:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,(bool)(auStack_b8[0] & 1));
      break;
    case 8:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,auStack_b8[0]);
      break;
    case 9:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,(float)auStack_b8._0_4_);
      break;
    case 10:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,(double)CONCAT44(auStack_b8._4_4_,auStack_b8._0_4_));
      break;
    case 0xb:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,
                      (longdouble)
                      CONCAT28(arg.value_.field_0.int_value._0_2_,
                               CONCAT44(auStack_b8._4_4_,auStack_b8._0_4_)));
      break;
    case 0xc:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,(char *)CONCAT44(auStack_b8._4_4_,auStack_b8._0_4_));
      break;
    case 0xd:
      basic_string_view<char>::basic_string_view
                (local_58,(char *)CONCAT44(auStack_b8._4_4_,auStack_b8._0_4_),
                 CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                          arg.value_.field_0.int_value._0_2_));
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,local_58[0]);
      break;
    case 0xe:
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                     ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                      &local_e0,(void *)CONCAT44(auStack_b8._4_4_,auStack_b8._0_4_));
      break;
    case 0xf:
      custom_00.value._4_4_ = auStack_b8._4_4_;
      custom_00.value._0_4_ = auStack_b8._0_4_;
      custom_00.format._0_2_ = arg.value_.field_0.int_value._0_2_;
      custom_00.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
      basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::handle::handle((handle *)&local_68,custom_00);
      local_10.container =
           (buffer<char> *)
           default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                     (&local_e0,(handle)local_68);
    }
    local_c0 = local_10.container;
    basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
              (pbVar2,(iterator)local_10.container);
  }
  else if (*end_local == '{') {
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(handler,end_local,begin + 2);
  }
  else {
    adapter.handler._0_4_ = 0;
    _auStack_1e0 = handler;
    end_local = parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                          (end_local,end,
                           (id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
                            *)auStack_1e0);
    if (end_local == end) {
      local_219 = '\0';
    }
    else {
      local_219 = *end_local;
    }
    if (local_219 == '}') {
      pbVar2 = (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
               (adapter._8_8_ + 0x20);
      get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
                ((format_arg *)auStack_188,(detail *)pbVar2,
                 (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                 (ulong)(uint)adapter.handler,(uint)adapter.handler);
      local_1b0.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(pbVar2);
      pbVar1 = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::args(pbVar2);
      local_1b0.args.desc_ = pbVar1->desc_;
      local_1b0.args.field_1 = pbVar1->field_1;
      local_1b0.loc =
           basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::locale(pbVar2);
      local_f8 = (format_arg *)auStack_188;
      local_f0 = &local_1b0;
      switch(arg_1.value_.field_0.int128_value._8_4_) {
      case 0:
      default:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0);
        break;
      case 1:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,auStack_188._0_4_);
        break;
      case 2:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,auStack_188._0_4_);
        break;
      case 3:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,CONCAT44(auStack_188._4_4_,auStack_188._0_4_));
        break;
      case 4:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,CONCAT44(auStack_188._4_4_,auStack_188._0_4_));
        break;
      case 5:
        value_01._10_6_ = in_stack_fffffffffffffdb2;
        value_01._0_10_ = in_stack_fffffffffffffda8;
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,(__int128)value_01);
        break;
      case 6:
        value_02._10_6_ = in_stack_fffffffffffffdb2;
        value_02._0_10_ = in_stack_fffffffffffffda8;
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,(unsigned___int128)value_02);
        break;
      case 7:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,(bool)(auStack_188[0] & 1));
        break;
      case 8:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,auStack_188[0]);
        break;
      case 9:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,(float)auStack_188._0_4_);
        break;
      case 10:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,(double)CONCAT44(auStack_188._4_4_,auStack_188._0_4_));
        break;
      case 0xb:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,
                        (longdouble)
                        CONCAT28(arg_1.value_.field_0.int_value._0_2_,
                                 CONCAT44(auStack_188._4_4_,auStack_188._0_4_)));
        break;
      case 0xc:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,(char *)CONCAT44(auStack_188._4_4_,auStack_188._0_4_));
        break;
      case 0xd:
        basic_string_view<char>::basic_string_view
                  (local_128,(char *)CONCAT44(auStack_188._4_4_,auStack_188._0_4_),
                   CONCAT62(arg_1.value_.field_0.long_long_value._2_6_,
                            arg_1.value_.field_0.int_value._0_2_));
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,local_128[0]);
        break;
      case 0xe:
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)
                        &local_1b0,(void *)CONCAT44(auStack_188._4_4_,auStack_188._0_4_));
        break;
      case 0xf:
        custom.value._4_4_ = auStack_188._4_4_;
        custom.value._0_4_ = auStack_188._0_4_;
        custom.format._0_2_ = arg_1.value_.field_0.int_value._0_2_;
        custom.format._2_6_ = arg_1.value_.field_0.long_long_value._2_6_;
        basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::handle::handle((handle *)&local_138,custom);
        local_e8.container =
             (buffer<char> *)
             default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                       (&local_1b0,(handle)local_138);
      }
      local_190 = local_e8.container;
      basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
                (pbVar2,(iterator)local_e8.container);
    }
    else {
      if (local_219 != ':') {
        error_handler::on_error((error_handler *)adapter._8_8_,"missing \'}\' in format string");
      }
      end_local = format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  ::on_format_specs((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                     *)adapter._8_8_,(uint)adapter.handler,end_local + 1,end);
      if ((end_local == end) || (*end_local != '}')) {
        error_handler::on_error((error_handler *)adapter._8_8_,"unknown format specifier");
      }
    }
  }
  return end_local + 1;
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}